

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateDefaultBoxedObject_TTD(JavascriptLibrary *this,TypeId kind)

{
  JavascriptBooleanObject *pJVar1;
  JavascriptStringObject *pJVar2;
  JavascriptSymbolObject *pJVar3;
  JavascriptNumberObject *pJVar4;
  
  if (kind == TypeIds_SymbolObject) {
    pJVar3 = CreateSymbolObject(this,(JavascriptSymbol *)0x0);
    return (RecyclableObject *)pJVar3;
  }
  if (kind == TypeIds_NumberObject) {
    pJVar4 = CreateNumberObject(this,&DAT_1000000000000);
    return (RecyclableObject *)pJVar4;
  }
  if (kind == TypeIds_StringObject) {
    pJVar2 = CreateStringObject(this,(JavascriptString *)0x0);
    return (RecyclableObject *)pJVar2;
  }
  if (kind == TypeIds_BooleanObject) {
    pJVar1 = CreateBooleanObject(this);
    return (RecyclableObject *)pJVar1;
  }
  TTDAbort_unrecoverable_error("Unsupported nullptr value boxed object.");
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateDefaultBoxedObject_TTD(Js::TypeId kind)
    {
        switch(kind)
        {
        case Js::TypeIds_BooleanObject:
            return this->CreateBooleanObject();
        case Js::TypeIds_NumberObject:
            return this->CreateNumberObject(Js::TaggedInt::ToVarUnchecked(0));
        case Js::TypeIds_StringObject:
            return this->CreateStringObject(nullptr);
        case Js::TypeIds_SymbolObject:
            return this->CreateSymbolObject(nullptr);
        default:
            TTDAssert(false, "Unsupported nullptr value boxed object.");
            return nullptr;
        }
    }